

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

int get_serverAtomicInt(void *fd,int *file_int_ptr,int byte_reversal)

{
  int iVar1;
  int junk_errno;
  int tmp_value;
  char *junk_result_str;
  uint local_18;
  int local_14;
  char *local_10;
  
  iVar1 = (*ffs_server_read_func)(fd,&local_14,4,(int *)&local_18,&local_10);
  if (iVar1 == 4) {
    *file_int_ptr = local_14;
  }
  else {
    local_14 = printf("SERVER READ FAILED, ERRNO = %d\n",(ulong)local_18);
  }
  return local_14;
}

Assistant:

static int
get_serverAtomicInt(void *fd, FILE_INT *file_int_ptr, int byte_reversal)
{
#if SIZEOF_INT == 4
    int tmp_value;
    int junk_errno;
    char *junk_result_str;
    if (ffs_server_read_func(fd, &tmp_value, 4, &junk_errno, &junk_result_str) != 4) {
	printf("SERVER READ FAILED, ERRNO = %d\n", junk_errno);

	return 0;
    }
#else
    Baaad shit;
#endif
    if (byte_reversal)
	byte_swap((char *) &tmp_value, 4);
    *file_int_ptr = tmp_value;
    return 1;
}